

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O1

void Prs_CreateOutConcat(Cba_Ntk_t *p,int *pSlices,int nSlices)

{
  int iVar1;
  uint f;
  Cba_Man_t *pCVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int *piVar8;
  Vec_Str_t *p_00;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  char *format;
  int iVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  
  iVar15 = *pSlices;
  pCVar2 = p->pDesign;
  Vec_IntFillExtra(&pCVar2->vNameMap,iVar15 + 1,nSlices);
  if ((-1 < (long)iVar15) && (iVar15 < (pCVar2->vNameMap).nSize)) {
    iVar13 = (pCVar2->vNameMap).pArray[iVar15];
    uVar7 = 0;
    uVar14 = 0;
    if (iVar13 != 0) {
      if (0 < iVar13) goto LAB_003e3360;
      pVVar3 = p->pDesign->vHash->vObjs;
      if (pVVar3->nSize <= iVar13 * -4) goto LAB_003e3360;
      uVar14 = pVVar3->pArray[(uint)(iVar13 * -4)];
    }
    if (iVar13 != 0) {
      if (0 < iVar13) {
LAB_003e3360:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      pVVar3 = p->pDesign->vHash->vObjs;
      uVar9 = iVar13 * -4;
      uVar7 = pVVar3->nSize;
      if (uVar7 == uVar9 || SBORROW4(uVar7,uVar9) != (int)(uVar7 + iVar13 * 4) < 0)
      goto LAB_003e3360;
      uVar7 = pVVar3->pArray[(ulong)uVar9 + 1];
    }
    uVar9 = uVar7;
    if ((int)uVar14 < (int)uVar7) {
      uVar9 = uVar14;
    }
    uVar16 = (ulong)uVar9;
    if ((int)uVar7 < (int)uVar14) {
      uVar7 = uVar14;
    }
    if (-1 < iVar13) {
      __assert_fail("RangeId > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                    ,0x637,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
    }
    uVar14 = uVar7 + 1;
    if ((p->vArray1).nCap <= (int)uVar7) {
      piVar8 = (p->vArray1).pArray;
      if (piVar8 == (int *)0x0) {
        piVar8 = (int *)malloc((long)(int)uVar14 << 2);
      }
      else {
        piVar8 = (int *)realloc(piVar8,(long)(int)uVar14 << 2);
      }
      (p->vArray1).pArray = piVar8;
      if (piVar8 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vArray1).nCap = uVar14;
    }
    if (-1 < (int)uVar7) {
      memset((p->vArray1).pArray,0,(ulong)uVar14 << 2);
    }
    (p->vArray1).nSize = uVar14;
    if (0 < nSlices) {
      uVar10 = 0;
      do {
        iVar13 = pSlices[uVar10 * 3 + 1];
        iVar11 = pSlices[uVar10 * 3 + 2];
        uVar14 = 0;
        if (iVar13 != 0) {
          if (iVar13 < 0) goto LAB_003e3360;
          pVVar3 = p->pDesign->vHash->vObjs;
          uVar14 = iVar13 * 4;
          uVar5 = pVVar3->nSize;
          if (uVar5 == uVar14 || SBORROW4(uVar5,uVar14) != (int)(uVar5 + iVar13 * -4) < 0)
          goto LAB_003e3360;
          uVar14 = pVVar3->pArray[uVar14];
        }
        if (iVar13 == 0) {
          uVar5 = 0;
        }
        else {
          if (iVar13 < 0) goto LAB_003e3360;
          pVVar3 = p->pDesign->vHash->vObjs;
          if (pVVar3->nSize <= iVar13 * 4) goto LAB_003e3360;
          uVar5 = pVVar3->pArray[(ulong)(uint)(iVar13 * 4) + 1];
        }
        uVar17 = uVar5;
        if ((int)uVar5 < (int)uVar14) {
          uVar17 = uVar14;
        }
        if ((iVar15 != pSlices[uVar10 * 3]) || (iVar11 < 1)) {
          __assert_fail("NameId == pSlices[3*i+0] && iFon > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                        ,0x642,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
        }
        if ((int)uVar14 < (int)uVar5) {
          uVar5 = uVar14;
        }
        uVar12 = (ulong)uVar5;
        if (((int)uVar5 < (int)uVar9) || ((int)uVar7 < (int)uVar17)) {
          __assert_fail("BotId <= Bot && Top <= TopId",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                        ,0x643,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
        }
        do {
          if (((int)uVar5 < 0) || (iVar13 = (int)uVar12, (p->vArray1).nSize <= iVar13))
          goto LAB_003e3322;
          piVar8 = (p->vArray1).pArray;
          if (piVar8[uVar12] != 0) {
            __assert_fail("Vec_IntEntry(vBits, k) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x646,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
          }
          piVar8[uVar12] = iVar11;
          uVar12 = uVar12 + 1;
        } while (iVar13 < (int)uVar17);
        uVar10 = uVar10 + 1;
      } while (uVar10 != (uint)nSlices);
    }
    iVar11 = 0;
    uVar10 = uVar16;
    iVar13 = -1;
    do {
      if (((int)uVar9 < 0) || (iVar4 = (int)uVar10, (p->vArray1).nSize <= iVar4)) goto LAB_003e3322;
      iVar1 = (p->vArray1).pArray[uVar10];
      iVar11 = iVar11 + (uint)(iVar13 != iVar1);
      uVar10 = uVar10 + 1;
      iVar13 = iVar1;
    } while (iVar4 < (int)uVar7);
    uVar14 = Cba_ObjAlloc(p,CBA_BOX_CONCAT,iVar11,1);
    if ((int)uVar14 < 1) {
      __assert_fail("i>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                    ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
    }
    if ((int)uVar14 < (p->vObjFon0).nSize) {
      iVar13 = (p->vObjFon0).pArray[uVar14];
      Cba_FonSetName(p,iVar13,iVar15);
      Prs_CreateRange(p,iVar13,iVar15);
      uVar9 = 0;
      uVar17 = 0;
      uVar5 = 0xffffffff;
      while (iVar15 = (int)uVar16, iVar15 < (p->vArray1).nSize) {
        f = (p->vArray1).pArray[uVar16];
        format = (char *)(ulong)f;
        if (uVar5 == f || uVar5 == 0xffffffff) {
          uVar17 = uVar17 + 1;
        }
        else {
          if (uVar5 == 0) {
            p_00 = Abc_NamBuffer(p->pDesign->pStrs);
            Vec_StrPrintF(p_00,format,(ulong)uVar17,"");
            uVar5 = Abc_NamStrFindOrAdd(p->pDesign->pFuns,p_00->pArray,(int *)0x0);
          }
          uVar6 = Cba_FonRangeSize(p,uVar5);
          if (uVar17 != uVar6) {
            __assert_fail("nBits == Cba_FonRangeSize(p, Prev)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x661,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
          }
          Cba_ObjSetFinFon(p,uVar14,~uVar9 + iVar11,uVar5);
          uVar17 = 1;
          uVar9 = uVar9 + 1;
        }
        uVar16 = uVar16 + 1;
        uVar5 = f;
        if ((int)uVar7 <= iVar15) {
          uVar7 = Cba_FonRangeSize(p,f);
          if (uVar17 != uVar7) {
            __assert_fail("nBits == Cba_FonRangeSize(p, Prev)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x667,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
          }
          Cba_ObjSetFinFon(p,uVar14,~uVar9 + iVar11,f);
          if (uVar9 + 1 != iVar11) {
            __assert_fail("k == nParts",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x669,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
          }
          return;
        }
      }
    }
  }
LAB_003e3322:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Prs_CreateOutConcat( Cba_Ntk_t * p, int * pSlices, int nSlices )
{
    Vec_Int_t * vBits = &p->vArray1;
    int NameId    = pSlices[0];
    int RangeId   = -Cba_NtkGetMap(p, NameId);
    int LeftId    = Cba_NtkRangeLeft( p, RangeId );
    int RightId   = Cba_NtkRangeRight( p, RangeId );
    int BotId     = Abc_MinInt( LeftId, RightId );
    int TopId     = Abc_MaxInt( LeftId, RightId );
    int i, k, iObj, iFon, nParts, Prev, nBits;
    assert( RangeId > 0 );
    Vec_IntFill( vBits, Abc_MaxInt(LeftId, RightId) + 1, 0 );
    // fill up with slices
    for ( i = 0; i < nSlices; i++ )
    {
        int Range = pSlices[3*i+1];
        int iFon  = pSlices[3*i+2];
        int Left  = Cba_NtkRangeLeft( p, Range );
        int Right = Cba_NtkRangeRight( p, Range );
        int Bot   = Abc_MinInt( Left, Right );
        int Top   = Abc_MaxInt( Left, Right );
        assert( NameId == pSlices[3*i+0] && iFon > 0 );
        assert( BotId <= Bot && Top <= TopId );
        for ( k = Bot; k <= Top; k++ )
        {
            assert( Vec_IntEntry(vBits, k) == 0 );
            Vec_IntWriteEntry( vBits, k, iFon );
        }
    }
    // check how many parts we have
    Prev = -1; nParts = 0; 
    Vec_IntForEachEntryStartStop( vBits, iFon, i, BotId, TopId+1 )
    {
        if ( Prev != iFon )
            nParts++;
        Prev = iFon;
    }
    // create new concatenation
    iObj = Cba_ObjAlloc( p, CBA_BOX_CONCAT, nParts, 1 );
    iFon = Cba_ObjFon0(p, iObj);
    Cba_FonSetName( p, iFon, NameId );
    Prs_CreateRange( p, iFon, NameId );
    // set inputs
    k = 0; Prev = -1; nBits = 0;
    Vec_IntForEachEntryStartStop( vBits, iFon, i, BotId, TopId+1 )
    {
        if ( Prev == -1 || Prev == iFon )
            nBits++;
        else
        {
            if ( Prev == 0 ) // create constant
                Prev = Cba_ManNewConstZero( p, nBits );
            assert( nBits == Cba_FonRangeSize(p, Prev) );
            Cba_ObjSetFinFon( p, iObj, nParts-1-k++, Prev );
            nBits = 1;
        }
        Prev = iFon;         
    }
    assert( nBits == Cba_FonRangeSize(p, Prev) );
    Cba_ObjSetFinFon( p, iObj, nParts-1-k++, Prev );
    assert( k == nParts );
}